

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O1

void lua_settable(lua_State *L,int idx)

{
  TValue *pTVar1;
  TValue *pTVar2;
  
  pTVar1 = index2adr(L,idx);
  pTVar2 = lj_meta_tset(L,pTVar1,L->top + -2);
  pTVar1 = L->top;
  if (pTVar2 == (TValue *)0x0) {
    pTVar1[2] = pTVar1[-5];
    L->top = pTVar1 + 3;
    lj_vm_call(L,pTVar1,1);
    L->top = L->top + -4;
  }
  else {
    L->top = pTVar1 + -2;
    *pTVar2 = pTVar1[-1];
  }
  return;
}

Assistant:

LUA_API void lua_settable(lua_State *L, int idx)
{
  TValue *o;
  cTValue *t = index2adr_check(L, idx);
  lj_checkapi_slot(2);
  o = lj_meta_tset(L, t, L->top-2);
  if (o) {
    /* NOBARRIER: lj_meta_tset ensures the table is not black. */
    L->top -= 2;
    copyTV(L, o, L->top+1);
  } else {
    TValue *base = L->top;
    copyTV(L, base+2, base-3-2*LJ_FR2);
    L->top = base+3;
    lj_vm_call(L, base, 0+1);
    L->top -= 3+LJ_FR2;
  }
}